

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

void __thiscall cmPolicies::PolicyMap::Set(PolicyMap *this,PolicyID id,PolicyStatus status)

{
  int iVar1;
  _WordT *p_Var2;
  ulong uVar3;
  
  iVar1 = id * 3;
  uVar3 = 1L << ((byte)iVar1 & 0x3f);
  if (status == OLD) {
    p_Var2 = (this->Status).super__Base_bitset<7UL>._M_w + ((ulong)(long)iVar1 >> 6);
    *p_Var2 = *p_Var2 | uVar3;
    p_Var2 = (this->Status).super__Base_bitset<7UL>._M_w + ((ulong)(long)(iVar1 + 1) >> 6);
    uVar3 = 1L << ((byte)(iVar1 + 1) & 0x3f);
  }
  else {
    p_Var2 = (this->Status).super__Base_bitset<7UL>._M_w + ((ulong)(long)iVar1 >> 6);
    *p_Var2 = *p_Var2 & ~uVar3;
    uVar3 = 1L << ((byte)(iVar1 + 1) & 0x3f);
    p_Var2 = (this->Status).super__Base_bitset<7UL>._M_w + ((ulong)(long)(iVar1 + 1) >> 6);
    if (status == WARN) {
      *p_Var2 = *p_Var2 | uVar3;
      p_Var2 = (this->Status).super__Base_bitset<7UL>._M_w + ((ulong)(long)(iVar1 + 2) >> 6);
      uVar3 = 1L << ((byte)(iVar1 + 2) & 0x3f);
      goto LAB_002b0d9f;
    }
  }
  *p_Var2 = *p_Var2 & ~uVar3;
  uVar3 = 1L << ((byte)(iVar1 + 2) & 0x3f);
  p_Var2 = (this->Status).super__Base_bitset<7UL>._M_w + ((ulong)(long)(iVar1 + 2) >> 6);
  if (status == NEW) {
    *p_Var2 = *p_Var2 | uVar3;
    return;
  }
LAB_002b0d9f:
  *p_Var2 = *p_Var2 & ~uVar3;
  return;
}

Assistant:

void cmPolicies::PolicyMap::Set(cmPolicies::PolicyID id,
                                cmPolicies::PolicyStatus status)
{
  this->Status[(POLICY_STATUS_COUNT * id) + OLD] = (status == OLD);
  this->Status[(POLICY_STATUS_COUNT * id) + WARN] = (status == WARN);
  this->Status[(POLICY_STATUS_COUNT * id) + NEW] = (status == NEW);
}